

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

ImGuiStoragePair * __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::insert
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *it,ImGuiStoragePair *v)

{
  ImGuiStoragePair *pIVar1;
  ImVector<ImGuiStorage::ImGuiStoragePair> *this_00;
  undefined8 *in_RDX;
  ImGuiStoragePair *in_RSI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  ptrdiff_t off;
  uint3 in_stack_ffffffffffffffdc;
  uint new_capacity;
  
  new_capacity = (uint)in_stack_ffffffffffffffdc;
  if (in_RDI->Data <= in_RSI) {
    new_capacity = CONCAT13(in_RSI <= in_RDI->Data + in_RDI->Size,in_stack_ffffffffffffffdc);
  }
  if ((char)(new_capacity >> 0x18) == '\0') {
    __assert_fail("it >= Data && it <= Data+Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                  ,0x549,
                  "T *ImVector<ImGuiStorage::ImGuiStoragePair>::insert(const T *, const T &) [T = ImGuiStorage::ImGuiStoragePair]"
                 );
  }
  this_00 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)((long)in_RSI - (long)in_RDI->Data >> 4);
  if (in_RDI->Size == in_RDI->Capacity) {
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(this_00,new_capacity);
  }
  if ((long)this_00 < (long)in_RDI->Size) {
    memmove(in_RDI->Data + (long)((long)&this_00->Size + 1),in_RDI->Data + (long)this_00,
            ((long)in_RDI->Size - (long)this_00) * 0x10);
  }
  pIVar1 = in_RDI->Data;
  *(undefined8 *)(pIVar1 + (long)this_00) = *in_RDX;
  pIVar1[(long)this_00].field_1 = *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)(in_RDX + 1);
  in_RDI->Size = in_RDI->Size + 1;
  return in_RDI->Data + (long)this_00;
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }